

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_frontend_test.cpp
# Opt level: O1

void __thiscall test_app::test_objects(test_app *this)

{
  _Base_ptr p_Var1;
  pointer pcVar2;
  _Base_ptr p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_t sVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  cache_interface *pcVar9;
  string *psVar10;
  const_iterator cVar11;
  ostream *poVar12;
  runtime_error *prVar13;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  t1;
  mydata d_2;
  ostringstream oss;
  mydata d;
  triggers_recorder tr;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  undefined1 local_248 [32];
  _Base_ptr local_228;
  size_t local_220;
  mydata local_218;
  _func_int *local_208 [2];
  undefined1 local_1f8 [32];
  _Base_ptr local_1d8;
  size_t sStack_1d0;
  mydata local_80;
  string local_70 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Data Object",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  set_context(this,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- With Triggers Full API",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_80.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00117c80;
  local_80.x = 1;
  local_80.y = 2;
  p_Var1 = (_Base_ptr)(local_248 + 8);
  local_248._8_8_ = (ulong)(uint)local_248._12_4_ << 0x20;
  local_248._16_8_ = (_Base_ptr)0x0;
  local_220 = 0;
  local_278._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_278._M_impl.super__Rb_tree_header._M_header;
  local_278._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)local_278._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_278._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar2 = local_1f8 + 0x10;
  local_278._M_impl.super__Rb_tree_header._M_header._M_right =
       local_278._M_impl.super__Rb_tree_header._M_header._M_left;
  local_248._24_8_ = p_Var1;
  local_228 = p_Var1;
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"k1","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)local_248,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"k2","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_278,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  local_218.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"bar","");
  cppcms::cache_interface::store_frame
            (psVar10,(string *)local_1f8,(set *)&local_218,(int)local_248,true);
  if (local_218.super_serializable.super_serializable_base._vptr_serializable_base !=
      (serializable_base)local_208) {
    operator_delete((void *)local_218.super_serializable.super_serializable_base.
                            _vptr_serializable_base);
  }
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  cppcms::cache_interface::store_data<mydata>
            (pcVar9,(string *)local_1f8,&local_80,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_278,-1,false);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar5 = sStack_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (sVar5 != 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xaf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tr.detach().size()==4",0x16);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_278);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248);
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_80.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00117c80;
  local_80.x = 0;
  local_80.y = 0;
  local_278._M_impl._0_8_ = &local_278._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_278._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)local_278._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(&local_278,0));
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xb6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_frame(\"foo\",tmp)",0x1f);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_80,false);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xb7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_data(\"dat\",d)",0x1c);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_80.x != 1) || (local_80.y != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xb8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," d.x==1 && d.y==2",0x11);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_278);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xb9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tmp==\"bar\"",0xb);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  if (local_220 != 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xbb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tg.size()==4",0xd);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248,(key_type *)local_1f8);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar11._M_node == p_Var1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xbc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tg.count(\"foo\")==1",0x13);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248,(key_type *)local_1f8);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar11._M_node == p_Var1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xbd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tg.count(\"dat\")==1",0x13);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"k1","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248,(key_type *)local_1f8);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar11._M_node == p_Var1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xbe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tg.count(\"k1\")==1",0x12);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"k2","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248,(key_type *)local_1f8);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar11._M_node == p_Var1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xbf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tg.count(\"k2\")==1",0x12);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248);
  if ((_Base_ptr *)local_278._M_impl._0_8_ !=
      &local_278._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_278._M_impl._0_8_);
  }
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_218.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00117c80;
  local_218.x = 0;
  local_218.y = 0;
  local_248._0_8_ = local_248 + 0x10;
  local_248._8_8_ = 0;
  local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(local_248,0));
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xc6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_frame(\"foo\",tmp,true)",0x24);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_218,true);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,199);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_data(\"dat\",d,true)",0x21);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_218.x != 1) || (local_218.y != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,200);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," d.x==1 && d.y==2",0x11);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = std::__cxx11::string::compare(local_248);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xc9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tmp==\"bar\"",0xb);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar5 = sStack_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (sVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xca);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tr.detach().size()==0",0x16);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_278._M_impl._0_8_ = &PTR_load_00117c80;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  local_278._M_impl.super__Rb_tree_header._M_header._4_4_ = 5;
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"baz","");
  cppcms::cache_interface::store_frame(psVar10,(string *)local_1f8,(int)local_248,true);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  cppcms::cache_interface::store_data<mydata>
            (pcVar9,(string *)local_1f8,(mydata *)&local_278,-1,false);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (sStack_1d0 != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xd2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tr.detach().size()==2",0x16);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_80.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00117c80;
  local_80.x = 0;
  local_80.y = 0;
  local_278._M_impl._0_8_ = &local_278._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_278._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_278._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)local_278._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(&local_278,0));
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xd9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_frame(\"foo\",tmp)",0x1f);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_80,false);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xda);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_data(\"dat\",d)",0x1c);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_80.x != 4) || (local_80.y != 5)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xdb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," d.x==4 && d.y==5",0x11);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = std::__cxx11::string::compare((char *)&local_278);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xdc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tmp==\"baz\"",0xb);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  if (local_220 != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xde);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tg.size()==2",0xd);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248,(key_type *)local_1f8);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar11._M_node == p_Var1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xdf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tg.count(\"foo\")==1",0x13);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_248,(key_type *)local_1f8);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar11._M_node == p_Var1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xe0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tg.count(\"dat\")==1",0x13);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_218);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_248);
  if ((_Base_ptr *)local_278._M_impl._0_8_ !=
      &local_278._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_278._M_impl._0_8_);
  }
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::clear();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-- Without Triggers",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_218.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00117c80;
  local_218.x = 1;
  local_218.y = 2;
  psVar10 = (string *)cppcms::application::cache();
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"foo","");
  local_278._M_impl._0_8_ = &local_278._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"bar","");
  p_Var3 = (_Base_ptr)(local_1f8 + 8);
  local_1f8._16_8_ = 0;
  local_1f8._0_8_ = (pointer)0x0;
  local_1f8._8_8_ = 0;
  sStack_1d0 = 0;
  local_1f8._24_8_ = p_Var3;
  local_1d8 = p_Var3;
  cppcms::cache_interface::store_frame
            (psVar10,(string *)local_248,(set *)&local_278,(int)local_1f8,true);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if ((_Base_ptr *)local_278._M_impl._0_8_ !=
      &local_278._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_278._M_impl._0_8_);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"dat","");
  local_1f8._16_8_ = 0;
  local_1f8._0_8_ = (pointer)0x0;
  local_1f8._8_8_ = 0;
  sStack_1d0 = 0;
  local_1f8._24_8_ = p_Var3;
  local_1d8 = p_Var3;
  cppcms::cache_interface::store_data<mydata>
            (pcVar9,(string *)local_248,&local_218,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1f8,-1,true);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar5 = sStack_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (sVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tr.detach().size()==0",0x16);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_218.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00117c80;
  local_218.x = 0;
  local_218.y = 0;
  local_248._0_8_ = local_248 + 0x10;
  local_248._8_8_ = 0;
  local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(local_248,0));
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xf3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_frame(\"foo\",tmp,true)",0x24);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_218,true);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xf4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_data(\"dat\",d,true)",0x21);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_218.x != 1) || (local_218.y != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xf5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," d.x==1 && d.y==2",0x11);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = std::__cxx11::string::compare(local_248);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xf6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tmp==\"bar\"",0xb);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar5 = sStack_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (sVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xf7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tr.detach().size()==0",0x16);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_218.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00117c80;
  local_218.x = 0;
  local_218.y = 0;
  local_248._0_8_ = local_248 + 0x10;
  local_248._8_8_ = 0;
  local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(local_248,0));
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xfe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_frame(\"foo\",tmp)",0x1f);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_218,false);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0xff);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_data(\"dat\",d)",0x1c);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_218.x != 1) || (local_218.y != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x100);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," d.x==1 && d.y==2",0x11);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = std::__cxx11::string::compare(local_248);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x101);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tmp==\"bar\"",0xb);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar5 = sStack_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (sVar5 != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x102);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tr.detach().size()==2",0x16);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_278._M_impl._0_8_ = &PTR_load_00117c80;
  local_278._M_impl.super__Rb_tree_header._M_header._M_color = 4;
  local_278._M_impl.super__Rb_tree_header._M_header._4_4_ = 5;
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  local_248._0_8_ = local_248 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"baz","");
  cppcms::cache_interface::store_frame(psVar10,(string *)local_1f8,(int)local_248,true);
  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  cppcms::cache_interface::store_data<mydata>
            (pcVar9,(string *)local_1f8,(mydata *)&local_278,-1,true);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar5 = sStack_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (sVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x10a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tr.detach().size()==0",0x16);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)local_248);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
  cppcms::application::cache();
  cppcms::cache_interface::reset();
  pcVar9 = (cache_interface *)cppcms::application::cache();
  cppcms::triggers_recorder::triggers_recorder((triggers_recorder *)local_70,pcVar9);
  local_218.super_serializable.super_serializable_base._vptr_serializable_base =
       (serializable_base)&PTR_load_00117c80;
  local_218.x = 0;
  local_218.y = 0;
  local_248._0_8_ = local_248 + 0x10;
  local_248._8_8_ = 0;
  local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
  psVar10 = (string *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo","");
  cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(local_248,0));
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (cVar6 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x111);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_frame(\"foo\",tmp,true)",0x24);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar9 = (cache_interface *)cppcms::application::cache();
  local_1f8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat","");
  bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_218,true);
  if ((pointer)local_1f8._0_8_ != pcVar2) {
    operator_delete((void *)local_1f8._0_8_);
  }
  if (!bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x112);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," cache().fetch_data(\"dat\",d,true)",0x21);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((local_218.x != 4) || (local_218.y != 5)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x113);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," d.x==4 && d.y==5",0x11);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = std::__cxx11::string::compare(local_248);
  if (iVar8 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x114);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," tmp==\"baz\"",0xb);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::triggers_recorder::detach_abi_cxx11_();
  sVar5 = sStack_1d0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
  if (sVar5 == 0) {
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_);
    }
    cppcms::triggers_recorder::~triggers_recorder((triggers_recorder *)local_70);
    cppcms::application::cache();
    cppcms::cache_interface::clear();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- Timeouts",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    cppcms::application::cache();
    cppcms::cache_interface::reset();
    local_278._M_impl._0_8_ = &PTR_load_00117c80;
    local_278._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
    local_278._M_impl.super__Rb_tree_header._M_header._4_4_ = 2;
    local_218.super_serializable.super_serializable_base._vptr_serializable_base =
         (serializable_base)&PTR_load_00117c80;
    local_218.x = 4;
    local_218.y = 5;
    psVar10 = (string *)cppcms::application::cache();
    paVar4 = &local_70[0].field_2;
    local_70[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"foo1","");
    local_248._0_8_ = local_248 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"baz1","");
    local_1f8._16_8_ = 0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = 0;
    sStack_1d0 = 0;
    local_1f8._24_8_ = p_Var3;
    local_1d8 = p_Var3;
    cppcms::cache_interface::store_frame
              (psVar10,(string *)local_70,(set *)local_248,(int)local_1f8,true);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8);
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_70[0]._M_dataplus._M_p);
    }
    pcVar9 = (cache_interface *)cppcms::application::cache();
    local_70[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"dat1","");
    local_1f8._16_8_ = 0;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = 0;
    sStack_1d0 = 0;
    local_1f8._24_8_ = p_Var3;
    local_1d8 = p_Var3;
    cppcms::cache_interface::store_data<mydata>
              (pcVar9,local_70,(mydata *)&local_278,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1f8,2,true);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_70[0]._M_dataplus._M_p);
    }
    psVar10 = (string *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo2","");
    local_70[0]._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"baz2","");
    cppcms::cache_interface::store_frame(psVar10,(string *)local_1f8,(int)local_70,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_70[0]._M_dataplus._M_p);
    }
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    pcVar9 = (cache_interface *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat2","");
    cppcms::cache_interface::store_data<mydata>(pcVar9,(string *)local_1f8,&local_218,2,true);
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    cppcms::application::cache();
    cppcms::cache_interface::reset();
    local_218.super_serializable.super_serializable_base._vptr_serializable_base =
         (serializable_base)&PTR_load_00117c80;
    local_218.x = 0;
    local_218.y = 0;
    local_80.super_serializable.super_serializable_base._vptr_serializable_base =
         (serializable_base)&PTR_load_00117c80;
    local_80.x = 0;
    local_80.y = 0;
    local_70[0]._M_string_length = 0;
    local_70[0].field_2._M_local_buf[0] = '\0';
    local_248._0_8_ = local_248 + 0x10;
    local_248._8_8_ = 0;
    local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
    local_70[0]._M_dataplus._M_p = (pointer)paVar4;
    psVar10 = (string *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo1","");
    cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(local_70,0));
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if (cVar6 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x128);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," cache().fetch_frame(\"foo1\",t1,true)",0x24);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    psVar10 = (string *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo2","");
    cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(local_248,0));
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if (cVar6 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x129);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," cache().fetch_frame(\"foo2\",t2,true)",0x24);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar9 = (cache_interface *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat1","");
    bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_218,true);
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if (!bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x12a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," cache().fetch_data(\"dat1\",d1,true)",0x23);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar9 = (cache_interface *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat2","");
    bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_80,true);
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if (!bVar7) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,299);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," cache().fetch_data(\"dat2\",d2,true)",0x23);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_218.x != 1) || (local_218.y != 2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,300);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," d1.x==1 && d1.y==2",0x13);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_80.x != 4) || (local_80.y != 5)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x12d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," d2.x==4 && d2.y==5",0x13);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar8 = std::__cxx11::string::compare((char *)local_70);
    if (iVar8 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x12e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," t1==\"baz1\"",0xb);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar8 = std::__cxx11::string::compare(local_248);
    if (iVar8 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x12f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," t2==\"baz2\"",0xb);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
      operator_delete((void *)local_248._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70[0]._M_dataplus._M_p != paVar4) {
      operator_delete(local_70[0]._M_dataplus._M_p);
    }
    booster::ptime::millisleep(3000);
    cppcms::application::cache();
    cppcms::cache_interface::reset();
    local_218.super_serializable.super_serializable_base._vptr_serializable_base =
         (serializable_base)&PTR_load_00117c80;
    local_218.x = 0;
    local_218.y = 0;
    local_80.super_serializable.super_serializable_base._vptr_serializable_base =
         (serializable_base)&PTR_load_00117c80;
    local_80.x = 0;
    local_80.y = 0;
    local_70[0]._M_string_length = 0;
    local_70[0].field_2._M_local_buf[0] = '\0';
    local_248._0_8_ = local_248 + 0x10;
    local_248._8_8_ = 0;
    local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
    local_70[0]._M_dataplus._M_p = (pointer)paVar4;
    psVar10 = (string *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo1","");
    cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(local_70,0));
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if (cVar6 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x136);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," !cache().fetch_frame(\"foo1\",t1,true)",0x25);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    psVar10 = (string *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"foo2","");
    cVar6 = cppcms::cache_interface::fetch_frame(psVar10,(string *)local_1f8,SUB81(local_248,0));
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if (cVar6 != '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x137);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," !cache().fetch_frame(\"foo2\",t2,true)",0x25);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar9 = (cache_interface *)cppcms::application::cache();
    local_1f8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat1","");
    bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_218,true);
    if ((pointer)local_1f8._0_8_ != pcVar2) {
      operator_delete((void *)local_1f8._0_8_);
    }
    if (!bVar7) {
      pcVar9 = (cache_interface *)cppcms::application::cache();
      local_1f8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"dat2","");
      bVar7 = cppcms::cache_interface::fetch_data<mydata>(pcVar9,(string *)local_1f8,&local_80,true)
      ;
      if ((pointer)local_1f8._0_8_ != pcVar2) {
        operator_delete((void *)local_1f8._0_8_);
      }
      if (!bVar7) {
        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
          operator_delete((void *)local_248._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70[0]._M_dataplus._M_p != paVar4) {
          operator_delete(local_70[0]._M_dataplus._M_p);
        }
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
                 ,0x66);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x139);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12," !cache().fetch_data(\"dat2\",d2,true)",0x24);
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar13,(string *)&local_278);
      __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
               ,0x66);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x138);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12," !cache().fetch_data(\"dat1\",d1,true)",0x24);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_278);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1f8,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cache_frontend_test.cpp"
             ,0x66);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f8,":",1);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)local_1f8,0x115);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," tr.detach().size()==0",0x16);
  prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar13,(string *)&local_278);
  __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_objects()
	{
		std::cout << "- Data Object" << std::endl;
		set_context(false);

		{
			std::cout << "-- With Triggers Full API" << std::endl;
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(1,2);
				std::set<std::string> t1,t2;
				t1.insert("k1");
				t2.insert("k2");
				cache().store_frame("foo","bar",t1);
				cache().store_data("dat",d,t2);
				TEST(tr.detach().size()==4);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				std::set<std::string> tg=tr.detach();
				TEST(tg.size()==4);
				TEST(tg.count("foo")==1);
				TEST(tg.count("dat")==1);
				TEST(tg.count("k1")==1);
				TEST(tg.count("k2")==1);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(4,5);
				cache().store_frame("foo","baz",-1);
				cache().store_data("dat",d,-1);
				TEST(tr.detach().size()==2);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==4  && d.y==5);
				TEST(tmp=="baz");
				std::set<std::string> tg=tr.detach();
				TEST(tg.size()==2);
				TEST(tg.count("foo")==1);
				TEST(tg.count("dat")==1);
			}
		}
		cache().clear();
		{
			std::cout << "-- Without Triggers" << std::endl;
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(1,2);
				cache().store_frame("foo","bar",std::set<std::string>(),-1,true);
				cache().store_data("dat",d,std::set<std::string>(),-1,true);
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp));
				TEST(cache().fetch_data("dat",d));
				TEST(d.x==1  && d.y==2);
				TEST(tmp=="bar");
				TEST(tr.detach().size()==2);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d(4,5);
				cache().store_frame("foo","baz",-1,true);
				cache().store_data("dat",d,-1,true);
				TEST(tr.detach().size()==0);
			}
			{
				cache().reset();
				cppcms::triggers_recorder tr(cache());
				mydata d;
				std::string tmp;
				TEST(cache().fetch_frame("foo",tmp,true));
				TEST(cache().fetch_data("dat",d,true));
				TEST(d.x==4  && d.y==5);
				TEST(tmp=="baz");
				TEST(tr.detach().size()==0);
			}
		}
		cache().clear();
		{
			std::cout << "-- Timeouts" << std::endl;
			{
				cache().reset();
				mydata d1(1,2);
				mydata d2(4,5);
				cache().store_frame("foo1","baz1",std::set<std::string>(),2,true);
				cache().store_data("dat1",d1,std::set<std::string>(),2,true);
				cache().store_frame("foo2","baz2",2,true);
				cache().store_data("dat2",d2,2,true);
			}
			{
				cache().reset();
				mydata d1,d2;
				std::string t1,t2;
				TEST(cache().fetch_frame("foo1",t1,true));
				TEST(cache().fetch_frame("foo2",t2,true));
				TEST(cache().fetch_data("dat1",d1,true));
				TEST(cache().fetch_data("dat2",d2,true));
				TEST(d1.x==1  && d1.y==2);
				TEST(d2.x==4  && d2.y==5);
				TEST(t1=="baz1");
				TEST(t2=="baz2");
			}
			booster::ptime::millisleep(3000);
			{
				cache().reset();
				mydata d1,d2;
				std::string t1,t2;
				TEST(!cache().fetch_frame("foo1",t1,true));
				TEST(!cache().fetch_frame("foo2",t2,true));
				TEST(!cache().fetch_data("dat1",d1,true));
				TEST(!cache().fetch_data("dat2",d2,true));
			}
		}


	}